

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O1

_Bool mp_decode_bool(char **data)

{
  char cVar1;
  _Bool _Var2;
  
  cVar1 = **data;
  *data = *data + 1;
  _Var2 = true;
  if (cVar1 != -0x3d) {
    if (cVar1 != -0x3e) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h"
                    ,0xaf5,"_Bool mp_decode_bool(const char **)");
    }
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

MP_IMPL bool
mp_decode_bool(const char **data)
{
	uint8_t c = mp_load_u8(data);
	switch (c) {
	case 0xc3:
		return true;
	case 0xc2:
		return false;
	default:
		mp_unreachable();
	}
}